

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O1

HashBucket * __thiscall
ValueHashTable<Sym_*,_Value_*>::GetBucket(ValueHashTable<Sym_*,_Value_*> *this,uint key)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  char cVar6;
  Type *unaff_R13;
  Type *pTVar7;
  undefined1 local_40 [8];
  Iterator __iter;
  
  local_40 = (undefined1  [8])(this->table + (ulong)key % (ulong)this->tableSize);
  __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_40
  ;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    if (__iter.list ==
        (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                  ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_40) break;
    pTVar5 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    uVar1 = pTVar5->value->m_id;
    if (uVar1 != key) {
      pTVar5 = unaff_R13;
    }
    cVar6 = (uVar1 != key) * '\x02' + '\x01';
    pTVar7 = pTVar5;
    if (key < uVar1) {
      cVar6 = '\0';
      pTVar7 = unaff_R13;
    }
    unaff_R13 = pTVar7;
    if (cVar6 != '\0') {
      pTVar7 = (Type *)0x0;
      if ((cVar6 != '\x03') && (pTVar7 = pTVar5, key < uVar1)) {
        pTVar7 = (Type *)0x0;
      }
      return pTVar7;
    }
  }
  return (HashBucket *)0x0;
}

Assistant:

HashBucket * GetBucket(uint key)
    {
        uint hash = this->Hash(key);
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY(HashBucket, bucket, &this->table[hash])
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    return &bucket;
                }
                break;
            }
        } NEXT_SLISTBASE_ENTRY;

        return nullptr;
    }